

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O0

QLoggingRegistry * QLoggingRegistry::instance(void)

{
  long lVar1;
  long in_FS_OFFSET;
  QScopedValueRollback<bool> rollback;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>_>
  *in_stack_ffffffffffffffb8;
  QScopedValueRollback<bool> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 value;
  Type *local_20;
  QScopedValueRollback<bool> local_18;
  long local_8;
  
  value = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = __tls_get_addr(&PTR_00bf6270);
  if ((*(byte *)(lVar1 + 0x29) & 1) == 0) {
    local_18.varRef._0_4_ = 0xaaaaaaaa;
    local_18.varRef._4_4_ = 0xaaaaaaaa;
    local_18.oldValue = true;
    local_18._9_3_ = 0xaaaaaa;
    local_18._12_4_ = 0xaaaaaaaa;
    __tls_get_addr(&PTR_00bf6270);
    QScopedValueRollback<bool>::QScopedValueRollback
              (in_stack_ffffffffffffffc0,(bool *)in_stack_ffffffffffffffb8,(bool)value);
    local_20 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>_>
               ::operator()(in_stack_ffffffffffffffb8);
    QScopedValueRollback<bool>::~QScopedValueRollback(&local_18);
  }
  else {
    local_20 = (Type *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QLoggingRegistry *QLoggingRegistry::instance()
{
    Q_CONSTINIT thread_local bool recursionGuard = false;
    if (recursionGuard)
        return nullptr;
    QScopedValueRollback<bool> rollback(recursionGuard, true);
    return qtLoggingRegistry();
}